

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *lhs,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *rhs)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  AssertionResult AVar4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  __s1 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar1 - (long)__s1;
  __s2 = (rhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if (__n == (long)(rhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__s2) {
    if (puVar1 != __s1) {
      iVar2 = bcmp(__s1,__s2,__n);
      if (iVar2 != 0) goto LAB_001c23a3;
    }
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
LAB_001c23a3:
    AVar4 = CmpHelperEQFailure<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    sVar3 = AVar4.message_.ptr_;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}